

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

void JitFFI::SysV64::CreateCaller(JitFuncCreater *jfc,ArgumentInfo *argumentinfo,void *func)

{
  OP op;
  bool bVar1;
  uint32_t uVar2;
  ArgTypeInfo *pAVar3;
  PassData *pPVar4;
  uint id;
  OP type;
  uint rnum;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  JitFuncCreater *local_98;
  void *local_90;
  undefined1 local_88 [40];
  ArgOPList aol;
  
  local_90 = func;
  pAVar3 = ArgumentInfo::data<(JitFFI::Platform)2,JitFFI::SysV64::ArgTypeInfo>(argumentinfo);
  uVar2 = pAVar3->num;
  aol.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&aol.datalist;
  aol.counter.int_count = 0;
  aol.counter.float_count = 0;
  aol.counter.memory_count = 0;
  aol.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
  ._M_impl._M_node._M_size = 0;
  aol.retdata = pAVar3->retdata;
  id = 0;
  aol._num = uVar2;
  aol.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       aol.datalist.data.c.
       super__List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (id == uVar2) {
      local_88._8_4_ = 0;
      local_88._16_8_ = (byte *)0x0;
      local_88[0x18] = false;
      local_88._28_8_ = 0;
      local_88._0_8_ = jfc;
      create_function_caller_head((JitFuncCallerCreater *)local_88);
      OpCode_x64::mov_rx_rx(jfc,r12,rdi);
      OpCode_x64::mov_rx_rx(jfc,rbx,rsi);
      local_88._28_4_ = aol.counter.int_count;
      local_88._32_4_ = aol.counter.float_count;
      local_88[0x18] = true;
      if (aol._num != 1) {
        OpCode_x64::_add_sub_rx_u32<(unsigned_char)192>
                  ((JitFuncCreater *)local_88._0_8_,rbx,aol._num * 8 - 8);
      }
      rnum = 0;
      local_98 = jfc;
      do {
        local_a8 = (code *)0x0;
        pcStack_a0 = (code *)0x0;
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_b8._M_unused._M_object = operator_new(0x18);
        *(uint **)local_b8._M_unused._0_8_ = &rnum;
        *(undefined1 **)((long)local_b8._M_unused._0_8_ + 8) = local_88;
        *(OP **)((long)local_b8._M_unused._0_8_ + 0x10) = &type;
        pcStack_a0 = std::
                     _Function_handler<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp:843:24)>
                     ::_M_invoke;
        local_a8 = std::
                   _Function_handler<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp:843:24)>
                   ::_M_manager;
        bVar1 = ArgOPList::do_next(&aol,(function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)>
                                         *)&local_b8);
        std::_Function_base::~_Function_base((_Function_base *)&local_b8);
      } while (bVar1);
      JitFuncCallerCreater::call((JitFuncCallerCreater *)local_88,local_90);
      OpCode_x64::mov_rx_rx(local_98,rbx,r12);
      create_return((JitFuncCallerCreater *)local_88,&aol.retdata);
      create_function_caller_foot((JitFuncCallerCreater *)local_88);
      std::__cxx11::
      _List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
      ::_M_clear((_List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
                  *)&aol.datalist);
      return;
    }
    pPVar4 = UPtrValVector<JitFFI::SysV64::ArgTypeInfo::PassData>::operator[]
                       (&pAVar3->typelist,(ulong)id);
    op = pPVar4->op;
    if (op - 1 < 2) {
      ArgOPList::add(&aol,id,op,0);
    }
    else if (op == op_memory) {
      ArgOPList::add_mem(&aol,id,(ulong)pPVar4->size);
    }
    else {
      if (op != op_struct) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                      ,0x2e6,"ArgOPList JitFFI::SysV64::create_argoplist(const ArgTypeInfo &)");
      }
      ArgOPList::add_stu(&aol,id,&pPVar4->spd,(uint)pPVar4->size);
    }
    id = id + 1;
    uVar2 = pAVar3->num;
  } while( true );
}

Assistant:

void CreateCaller(JitFuncCreater &jfc, const ArgumentInfo &argumentinfo, void *func)
		{
			ArgOPList aol = create_argoplist(get_argtypeinfo(argumentinfo));


			JitFuncCallerCreater jfcc(jfc);
			create_function_caller_head(jfcc);

			mov(jfc, r12, rdi);
			mov(jfc, rbx, rsi);
			create_argument(jfcc, aol);

			jfcc.call(func);

			mov(jfc, rbx, r12);
			create_return(jfcc, aol.get_retdata());

			create_function_caller_foot(jfcc);

		}